

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::CommonFunctionCase::init(CommonFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  ShaderExecutor *pSVar3;
  TestError *this_00;
  string local_40;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  (this->m_spec).version = bVar1 | GLSL_VERSION_310_ES;
  pSVar3 = deqp::gls::ShaderExecUtil::createExecutor
                     (((this->super_TestCase).m_context)->m_renderCtx,this->m_shaderType,
                      &this->m_spec);
  this->m_executor = pSVar3;
  (*pSVar3->_vptr_ShaderExecutor[3])
            (pSVar3,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  iVar2 = (*this->m_executor->_vptr_ShaderExecutor[2])();
  if ((char)iVar2 != '\0') {
    return iVar2;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Compile failed","");
  tcu::TestError::TestError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void CommonFunctionCase::init (void)
{
	DE_ASSERT(!m_executor);

	m_spec.version = contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;

	m_executor = createExecutor(m_context.getRenderContext(), m_shaderType, m_spec);
	m_testCtx.getLog() << m_executor;

	if (!m_executor->isOk())
		throw tcu::TestError("Compile failed");
}